

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpge.cpp
# Opt level: O1

void __thiscall jpge::jpeg_encoder::load_block_8_8(jpeg_encoder *this,int x,int y,int c)

{
  long lVar1;
  long lVar2;
  long lVar3;
  
  lVar2 = (long)(c + x * 0x18);
  lVar3 = 0;
  do {
    lVar1 = *(long *)((long)this->m_mcu_lines + lVar3 + (long)(y << 3) * 8);
    this->m_sample_array[lVar3] = *(byte *)(lVar1 + lVar2) - 0x80;
    this->m_sample_array[lVar3 + 1] = *(byte *)(lVar1 + 3 + lVar2) - 0x80;
    this->m_sample_array[lVar3 + 2] = *(byte *)(lVar1 + 6 + lVar2) - 0x80;
    this->m_sample_array[lVar3 + 3] = *(byte *)(lVar1 + 9 + lVar2) - 0x80;
    this->m_sample_array[lVar3 + 4] = *(byte *)(lVar1 + 0xc + lVar2) - 0x80;
    this->m_sample_array[lVar3 + 5] = *(byte *)(lVar1 + 0xf + lVar2) - 0x80;
    this->m_sample_array[lVar3 + 6] = *(byte *)(lVar1 + 0x12 + lVar2) - 0x80;
    this->m_sample_array[lVar3 + 7] = *(byte *)(lVar1 + 0x15 + lVar2) - 0x80;
    lVar3 = lVar3 + 8;
  } while (lVar3 != 0x40);
  return;
}

Assistant:

void jpeg_encoder::load_block_8_8(int x, int y, int c)
	{
		uint8* pSrc;
		sample_array_t* pDst = m_sample_array;
		x = (x * (8 * 3)) + c;
		y <<= 3;
		for (int i = 0; i < 8; i++, pDst += 8)
		{
			pSrc = m_mcu_lines[y + i] + x;
			pDst[0] = pSrc[0 * 3] - 128; pDst[1] = pSrc[1 * 3] - 128; pDst[2] = pSrc[2 * 3] - 128; pDst[3] = pSrc[3 * 3] - 128;
			pDst[4] = pSrc[4 * 3] - 128; pDst[5] = pSrc[5 * 3] - 128; pDst[6] = pSrc[6 * 3] - 128; pDst[7] = pSrc[7 * 3] - 128;
		}
	}